

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

pair<double_*,_bool> __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<1>::insert_entry
          (InnerLeaf<1> *this,uint64_t fullHash,int hashPos,Entry *entry)

{
  uint uVar1;
  byte bVar2;
  long lVar3;
  double *pdVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 uVar8;
  unsigned_long *puVar9;
  ulong uVar10;
  int in_R8D;
  ulong uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  pair<double_*,_bool> pVar14;
  uint local_24;
  
  uVar11 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  bVar2 = (byte)(uVar11 >> 10);
  uVar10 = (this->occupation).occupation;
  uVar7 = POPCOUNT(uVar10 >> (bVar2 & 0x3f));
  local_24 = (uint)uVar7;
  if ((uVar10 >> (uVar11 >> 10 & 0x3f) & 1) == 0) {
    (this->occupation).occupation = uVar10 | 1L << (bVar2 & 0x3f);
    uVar5 = this->size;
    if ((int)local_24 < (int)uVar5) {
      puVar9 = (this->hashes)._M_elems + uVar7;
      uVar7 = (ulong)(local_24 - 1);
      do {
        local_24 = (int)uVar7 + 1;
        uVar7 = (ulong)local_24;
        uVar10 = *puVar9;
        puVar9 = puVar9 + 1;
      } while ((uVar11 & 0xffff) < uVar10);
    }
  }
  else {
    uVar5 = local_24 - 2;
    uVar10 = (ulong)(local_24 * 8);
    do {
      uVar7 = uVar10 + 8;
      uVar5 = uVar5 + 1;
      lVar3 = uVar10 - 8;
      uVar10 = uVar7;
    } while ((uVar11 & 0xffff) < *(ulong *)((long)(this->hashes)._M_elems + lVar3));
    uVar1 = this->size;
    uVar6 = uVar5;
    if (uVar1 == uVar5) goto LAB_00327015;
    do {
      local_24 = uVar5;
      if (*(ulong *)((long)(this->hashes)._M_elems + (uVar7 - 0x10)) != (uVar11 & 0xffff)) break;
      uVar8 = *(undefined8 *)((long)(this->hashes)._M_elems + uVar7 * 2 + 0x18);
      auVar12._0_4_ = -(uint)((int)uVar8 == (entry->key_).first);
      iVar13 = -(uint)((int)((ulong)uVar8 >> 0x20) == (entry->key_).second);
      auVar12._4_4_ = auVar12._0_4_;
      auVar12._8_4_ = iVar13;
      auVar12._12_4_ = iVar13;
      in_R8D = movmskpd(in_R8D,auVar12);
      if (in_R8D == 3) {
        pdVar4 = &(this->entries)._M_elems[(int)uVar5].value_;
        uVar8 = 0;
        goto LAB_0032705a;
      }
      uVar5 = uVar5 + 1;
      uVar7 = uVar7 + 8;
      local_24 = uVar1;
    } while (uVar1 != uVar5);
    uVar7 = (ulong)local_24;
    uVar5 = uVar1;
  }
  uVar6 = (uint)uVar7;
  if ((int)(uint)uVar7 < (int)uVar5) {
    move_backward(this,(int *)&local_24,&this->size);
    uVar5 = this->size;
    uVar6 = local_24;
  }
LAB_00327015:
  pdVar4 = &(this->entries)._M_elems[(int)uVar6].value_;
  (this->entries)._M_elems[(int)uVar6].key_.first = (entry->key_).first;
  (this->entries)._M_elems[(int)uVar6].key_.second = (entry->key_).second;
  *pdVar4 = entry->value_;
  (this->hashes)._M_elems[(int)uVar6] = uVar11 & 0xffff;
  this->size = uVar5 + 1;
  (this->hashes)._M_elems[(long)(int)uVar5 + 1] = 0;
  uVar8 = CONCAT71((uint7)(uint3)(uVar5 + 1 >> 8),1);
LAB_0032705a:
  pVar14._8_8_ = uVar8;
  pVar14.first = pdVar4;
  return pVar14;
}

Assistant:

std::pair<ValueType*, bool> insert_entry(uint64_t fullHash, int hashPos,
                                             Entry& entry) {
      assert(size < capacity());
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);

      int pos = occupation.num_set_until(hashChunk);

      if (occupation.test(hashChunk)) {
        // since the occupation flag is set we need to start searching from
        // pos-1 and can rely on a hash chunk with the same value existing for
        // the scan
        --pos;
        while (hashes[pos] > hash) ++pos;

        if (find_key(entry.key(), hash, pos))
          return std::make_pair(&entries[pos].value(), false);

      } else {
        occupation.set(hashChunk);

        if (pos < size)
          while (hashes[pos] > hash) ++pos;
      }

      if (pos < size) move_backward(pos, size);
      entries[pos] = std::move(entry);
      hashes[pos] = hash;
      ++size;
      hashes[size] = 0;

      return std::make_pair(&entries[pos].value(), true);
    }